

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdset.c
# Opt level: O3

void TryRemovePollFd(fdset_s *self,sock fd)

{
  int iVar1;
  pollfd *ppVar2;
  long lVar3;
  
  iVar1 = self->nfds;
  if (0 < (long)iVar1) {
    ppVar2 = self->pollFds;
    lVar3 = 0;
    do {
      if (ppVar2[lVar3].fd == fd) {
        memmove(ppVar2 + lVar3,ppVar2 + lVar3 + 1,(long)(int)(~(uint)lVar3 + iVar1) << 3);
        iVar1 = self->nfds;
        self->nfds = iVar1 + -1;
        if (0 < iVar1) {
          return;
        }
        __assert_fail("self->nfds >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/fdset.c"
                      ,0x53,"void TryRemovePollFd(struct fdset_s *, sock)");
      }
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
  }
  return;
}

Assistant:

static
void TryRemovePollFd(struct fdset_s* self, sock fd)
{
    int pos = -1;
    int i = 0;
    for (; i < self->nfds; i++)
    {
        if(self->pollFds[i].fd == fd)
        {
            pos = i;
            break;
        }
    }

    if (pos != -1)
    {
        memmove(self->pollFds + pos, self->pollFds + pos + 1, sizeof(struct pollfd)*(self->nfds - pos - 1));
        self->nfds--;
        assert(self->nfds >= 0);
    }
}